

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O1

void Imf_3_4::Xdr::write<Imf_3_4::CharPtrIO,char*>(char **out,uint64_t v)

{
  uchar uVar1;
  uchar *puVar2;
  long lVar3;
  uchar b [8];
  
  b = (uchar  [8])v;
  lVar3 = 0;
  do {
    uVar1 = b[lVar3];
    puVar2 = (uchar *)*out;
    *out = (char *)(puVar2 + 1);
    *puVar2 = uVar1;
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 8);
  return;
}

Assistant:

void
write (T& out, uint64_t v)
{
    unsigned char b[8];

    b[0] = (unsigned char) (v);
    b[1] = (unsigned char) (v >> 8);
    b[2] = (unsigned char) (v >> 16);
    b[3] = (unsigned char) (v >> 24);
    b[4] = (unsigned char) (v >> 32);
    b[5] = (unsigned char) (v >> 40);
    b[6] = (unsigned char) (v >> 48);
    b[7] = (unsigned char) (v >> 56);

    writeUnsignedChars<S> (out, b, 8);
}